

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O1

void __thiscall QProcess::setChildProcessModifier(QProcess *this,function<void_()> *modifier)

{
  QObjectData *this_00;
  QObjectData *pQVar1;
  UnixExtras *__ptr;
  _func_int **pp_Var2;
  
  pQVar1 = (this->super_QIODevice).super_QObject.d_ptr.d;
  this_00 = pQVar1 + 8;
  if (pQVar1[8]._vptr_QObjectData == (_func_int **)0x0) {
    pp_Var2 = (_func_int **)operator_new(0x40);
    *pp_Var2 = (_func_int *)0x0;
    pp_Var2[1] = (_func_int *)0x0;
    pp_Var2[2] = (_func_int *)0x0;
    pp_Var2[3] = (_func_int *)0x0;
    pp_Var2[4] = (_func_int *)0x0;
    pp_Var2[5] = (_func_int *)0x0;
    pp_Var2[6] = (_func_int *)0x0;
    pp_Var2[7] = (_func_int *)0x0;
    __ptr = (UnixExtras *)this_00->_vptr_QObjectData;
    this_00->_vptr_QObjectData = pp_Var2;
    if (__ptr != (UnixExtras *)0x0) {
      std::default_delete<QProcessPrivate::UnixExtras>::operator()
                ((default_delete<QProcessPrivate::UnixExtras> *)this_00,__ptr);
    }
  }
  std::function<void_()>::operator=((function<void_()> *)this_00->_vptr_QObjectData,modifier);
  return;
}

Assistant:

void QProcess::setChildProcessModifier(const std::function<void(void)> &modifier)
{
    Q_D(QProcess);
    if (!d->unixExtras)
        d->unixExtras.reset(new QProcessPrivate::UnixExtras);
    d->unixExtras->childProcessModifier = modifier;
}